

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::addClassInfos(Generator *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  const_iterator o;
  long in_RDI;
  long in_FS_OFFSET;
  ClassInfoDef *c;
  add_const_t<QList<ClassInfoDef>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArray *in_stack_ffffffffffffffa8;
  QList<ClassInfoDef> *in_stack_ffffffffffffffb0;
  FILE *__stream;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (ClassInfoDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<ClassInfoDef>::begin(in_stack_ffffffffffffffb0);
  o = QList<ClassInfoDef>::end(in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = QList<ClassInfoDef>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<ClassInfoDef>::const_iterator::operator*(&local_10);
    __stream = *(FILE **)(in_RDI + 8);
    uVar2 = stridx((Generator *)__stream,in_stack_ffffffffffffffa8);
    uVar3 = stridx((Generator *)__stream,in_stack_ffffffffffffffa8);
    fprintf(__stream,"            { %4d, %4d },\n",(ulong)uVar2,(ulong)uVar3);
    QList<ClassInfoDef>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::addClassInfos()
{
    for (const ClassInfoDef &c : std::as_const(cdef->classInfoList))
        fprintf(out, "            { %4d, %4d },\n", stridx(c.name), stridx(c.value));
}